

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void reset_visible_character(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  room_t rVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  bVar1 = vischar->character;
  uVar3 = (ulong)bVar1;
  if (uVar3 != 0xff) {
    if (0x19 < bVar1) {
      vischar->character = 0xff;
      vischar->flags = 0xff;
      vischar->counter_and_flags = '\0';
      lVar5 = 0x140;
      if (uVar3 == 0x1b) {
        lVar5 = 0x158;
      }
      lVar4 = 0x128;
      if (uVar3 != 0x1a) {
        lVar4 = lVar5;
      }
      *(uint16_t *)((long)state->jmpbuf_main[0].__jmpbuf + lVar4 + -0x1c) = (vischar->mi).mappos.w;
      *(undefined4 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar4 + -0x20) =
           *(undefined4 *)&(vischar->mi).mappos;
      return;
    }
    state->character_structs[uVar3].character_and_flags =
         state->character_structs[uVar3].character_and_flags & 0xbf;
    rVar2 = vischar->room;
    state->character_structs[uVar3].room = rVar2;
    vischar->counter_and_flags = '\0';
    if (rVar2 == '\0') {
      lVar5 = 0;
      do {
        (&state->character_structs[uVar3].mappos.u)[lVar5] =
             (uint8_t)((&(vischar->mi).mappos.u)[lVar5] + 4 >> 3);
        lVar5 = lVar5 + 1;
      } while ((char)lVar5 != '\x03');
    }
    else {
      state->character_structs[uVar3].mappos.u = (uint8_t)(vischar->mi).mappos.u;
      state->character_structs[uVar3].mappos.v = (uint8_t)(vischar->mi).mappos.v;
      state->character_structs[uVar3].mappos.w = (uint8_t)(vischar->mi).mappos.w;
    }
    vischar->character = 0xff;
    vischar->flags = 0xff;
    if (((bVar1 & 0x1c) == 0x10) &&
       ((vischar->route).index = 0xff, (vischar->route).step = '\0', 0x11 < bVar1)) {
      (vischar->route).index = 0xff;
      (vischar->route).step = '\x18';
    }
    state->character_structs[uVar3].route = vischar->route;
  }
  return;
}

Assistant:

void reset_visible_character(tgestate_t *state, vischar_t *vischar)
{
  character_t        character; /* was A */
  mappos16_t        *mappos;    /* was DE */
  characterstruct_t *charstr;   /* was DE */
  room_t             room;      /* was A */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_NONE)
    return;

  if (character >= character_26_STOVE_1)
  {
    /* A stove or crate character. */

    vischar->character         = character_NONE;
    vischar->flags             = vischar_FLAGS_EMPTY_SLOT; /* flags */
    vischar->counter_and_flags = 0;    /* more flags */

    /* Save the old position. */
    if (character == character_26_STOVE_1)
      mappos = &state->movable_items[movable_item_STOVE1].mappos;
    else if (character == character_27_STOVE_2)
      mappos = &state->movable_items[movable_item_STOVE2].mappos;
    else
      mappos = &state->movable_items[movable_item_CRATE].mappos;

    /* The DOS version of the game has a difference here. Instead of
     * memcpy'ing the current vischar's position into the movable_items's
     * position, it only copies the first two bytes. The code is setup for a
     * copy of six bytes (cx is set to 3) but the 'movsw' ought to be a 'rep
     * movsw' for it to work. It fixes the bug where stoves get left in place
     * after a restarted game, but almost looks like an accident.
     */
    memcpy(mappos, &vischar->mi.mappos, sizeof(*mappos));
  }
  else
  {
    mappos16_t *vispos_in;   /* was HL */
    mappos8_t  *charpos_out; /* was DE */

    /* A non-object character. */

    charstr = &state->character_structs[character];

    /* Re-enable the character. */
    charstr->character_and_flags &= ~characterstruct_FLAG_ON_SCREEN;

    room = vischar->room;
    charstr->room = room;

    vischar->counter_and_flags = 0; /* more flags */

    /* Save the old position. */

    vispos_in   = &vischar->mi.mappos;
    charpos_out = &charstr->mappos;

    if (room == room_0_OUTDOORS)
    {
      /* Outdoors. */
      scale_mappos_down(vispos_in, charpos_out);
    }
    else
    {
      /* Indoors. */
      /* Conv: Unrolled from original code. */
      charpos_out->u = vispos_in->u; // note: narrowing
      charpos_out->v = vispos_in->v; // note: narrowing
      charpos_out->w = vispos_in->w; // note: narrowing
    }

    // character = vischar->character; /* Done in original code, but we already have this from earlier. */
    vischar->character = character_NONE;
    vischar->flags     = vischar_FLAGS_EMPTY_SLOT;

    /* Guard dogs only. */
    if (character >= character_16_GUARD_DOG_1 &&
        character <= character_19_GUARD_DOG_4)
    {
      /* Choose random locations in the fenced off area (right side). */
      vischar->route.index = routeindex_255_WANDER; /* 0..7 */
      vischar->route.step  = 0;
      if (character >= character_18_GUARD_DOG_3) /* Characters 18 and 19 */
      {
        /* Choose random locations in the fenced off area (bottom side). */
        vischar->route.index = routeindex_255_WANDER; /* 24..31 */
        vischar->route.step  = 24;
      }
    }

    charstr->route = vischar->route;
  }
}